

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O0

forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> __thiscall
TasGrid::readTensorDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions)

{
  unsigned_long in_RCX;
  TensorData local_a8;
  int local_38;
  int i;
  int local_28;
  undefined1 local_21;
  int num_entries;
  size_t num_dimensions_local;
  istream *is_local;
  forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> *tensors;
  
  local_21 = 0;
  _num_entries = (istream *)num_dimensions;
  num_dimensions_local = (size_t)is;
  is_local = (istream *)this;
  ::std::forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>::forward_list
            ((forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> *)this);
  local_28 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>((istream *)num_dimensions_local);
  for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
    local_a8.weight =
         IO::readNumber<TasGrid::IO::mode_ascii_type,double>((istream *)num_dimensions_local);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              (&local_a8.tensor,(IO *)num_dimensions_local,_num_entries,in_RCX);
    MultiIndexSet::MultiIndexSet(&local_a8.points);
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._12_4_ = 0;
    local_a8.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    ::std::vector<bool,_std::allocator<bool>_>::vector(&local_a8.loaded);
    ::std::forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>::
    emplace_front<TasGrid::TensorData>
              ((forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> *)this,
               &local_a8);
    TensorData::~TensorData(&local_a8);
  }
  return (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)
         (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)this;
}

Assistant:

std::forward_list<TensorData> readTensorDataList(std::istream &is, size_t num_dimensions){
    std::forward_list<TensorData> tensors;
    int num_entries = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_entries; i++){
        tensors.emplace_front(TensorData{
                              IO::readNumber<iomode, double>(is), // weight
                              IO::readVector<iomode, int>(is, num_dimensions), // tensor
                              MultiIndexSet(), // points, will be set later
                              std::vector<bool>() // loaded, will be set later
                              });
    }

    return tensors;
}